

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O3

int rtr_bgpsec_prepend_sig_seg(rtr_bgpsec *bgpsec,rtr_signature_seg *new_seg)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = -1;
  if (((new_seg != (rtr_signature_seg *)0x0) && (new_seg->signature != (uint8_t *)0x0)) &&
     (new_seg->sig_len != 0)) {
    iVar2 = ski_is_empty(new_seg->ski);
    if (iVar2 == 0) {
      if (bgpsec->sigs != (rtr_signature_seg *)0x0) {
        new_seg->next = bgpsec->sigs;
      }
      bgpsec->sigs = new_seg;
      bgpsec->sigs_len = bgpsec->sigs_len + 1;
      iVar3 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_bgpsec_prepend_sig_seg(struct rtr_bgpsec *bgpsec, struct rtr_signature_seg *new_seg)
{
	if (!new_seg || !new_seg->signature || !new_seg->sig_len || ski_is_empty(new_seg->ski))
		return RTR_BGPSEC_ERROR;

	if (bgpsec->sigs)
		new_seg->next = bgpsec->sigs;

	bgpsec->sigs = new_seg;
	bgpsec->sigs_len++;

	return RTR_BGPSEC_SUCCESS;
}